

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void __thiscall
duckdb::BitpackingScanState<unsigned_short,_short>::LoadNextGroup
          (BitpackingScanState<unsigned_short,_short> *this)

{
  BitpackingMode BVar1;
  uint uVar2;
  uint *puVar3;
  unsigned_short *puVar4;
  InternalException *this_00;
  long lVar5;
  string local_40;
  
  this->current_group_offset = 0;
  puVar3 = (uint *)this->bitpacking_metadata_ptr;
  uVar2 = *puVar3;
  this->current_group =
       (bitpacking_metadata_t)
       ((ulong)(uVar2 & 0xffffff) << 0x20 | (ulong)*(byte *)((long)puVar3 + 3));
  this->bitpacking_metadata_ptr = (data_ptr_t)(puVar3 + -1);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  puVar4 = (unsigned_short *)
           (((this->handle).node.ptr)->buffer +
           (ulong)(uVar2 & 0xffffff) + this->current_segment->offset);
  this->current_group_ptr = (data_ptr_t)puVar4;
  BVar1 = (this->current_group).mode;
  if (BVar1 - 3 < 3) {
    this->current_frame_of_reference = *puVar4;
    this->current_group_ptr = (data_ptr_t)(puVar4 + 1);
    if (BVar1 == CONSTANT_DELTA) {
      this->current_constant = puVar4[1];
      lVar5 = 4;
    }
    else {
      this->current_width = (bitpacking_width_t)puVar4[1];
      this->current_group_ptr = (data_ptr_t)(puVar4 + 2);
      if (BVar1 != DELTA_FOR) {
        return;
      }
      this->current_delta_offset = puVar4[2];
      lVar5 = 6;
    }
  }
  else {
    if (BVar1 != CONSTANT) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Invalid bitpacking mode","");
      InternalException::InternalException(this_00,&local_40);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->current_constant = *puVar4;
    lVar5 = 2;
  }
  this->current_group_ptr = (data_ptr_t)((long)puVar4 + lVar5);
  return;
}

Assistant:

void LoadNextGroup() {
		D_ASSERT(bitpacking_metadata_ptr > handle.Ptr() &&
		         (bitpacking_metadata_ptr < handle.Ptr() + current_segment.GetBlockManager().GetBlockSize()));
		current_group_offset = 0;
		current_group = DecodeMeta(reinterpret_cast<bitpacking_metadata_encoded_t *>(bitpacking_metadata_ptr));

		bitpacking_metadata_ptr -= sizeof(bitpacking_metadata_encoded_t);
		current_group_ptr = GetPtr(current_group);

		// Read first value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::CONSTANT_DELTA:
		case BitpackingMode::DELTA_FOR:
			current_frame_of_reference = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read second value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT_DELTA:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::DELTA_FOR:
			current_width = (bitpacking_width_t)(*reinterpret_cast<T *>(current_group_ptr));
			current_group_ptr += MaxValue(sizeof(T), sizeof(bitpacking_width_t));
			break;
		case BitpackingMode::CONSTANT:
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read third value
		if (current_group.mode == BitpackingMode::DELTA_FOR) {
			current_delta_offset = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
		}
	}